

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

void openjtalk_setGvWeight(OpenJTalk *oj,uint i,double f)

{
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_RDI == 0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    *(undefined4 *)(in_RDI + 0x678) = 0;
    if (in_XMM0_Qa < 0.0) {
      in_XMM0_Qa = 0.0;
    }
    if (in_ESI == 0) {
      *(double *)(in_RDI + 0x620) = in_XMM0_Qa;
    }
    else if (in_ESI == 1) {
      *(double *)(in_RDI + 0x628) = in_XMM0_Qa;
    }
    Open_JTalk_set_gv_weight
              ((Open_JTalk *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(size_t)in_XMM0_Qa,
               8.31433431447483e-318);
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_setGvWeight(OpenJTalk *oj, unsigned int i, double f)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	oj->errorCode = OPENJTALKERROR_NO_ERROR;
	if (f < 0.0)
	{
		f = 0.0;
	}
	if (i == 0)
	{
		oj->gv_weight0 = f;
	}
	else if (i == 1)
	{
		oj->gv_weight1 = f;
	}
	Open_JTalk_set_gv_weight(oj->open_jtalk, i, f);
}